

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void returnStatement(object *proc,int retSize)

{
  item *x;
  int c;
  int b;
  int op;
  
  x = (item *)calloc(1,0x30);
  if (currentSymbol == 0xcb) {
    getSymbol();
    return;
  }
  expression(x);
  if (proc->retTypeIndex != x->typeIndex) {
    mark("wrong return type");
    exit(-1);
  }
  switch(x->mode) {
  case 0x2bd:
    c = x->a;
    op = 0x10;
    goto LAB_00107a5d;
  default:
    goto switchD_00107a4a_caseD_2be;
  case 0x2c1:
    c = x->a;
    op = 0x20;
    b = 0x1d;
    break;
  case 0x2c2:
    c = x->r;
    op = 0;
LAB_00107a5d:
    b = 0;
    break;
  case 0x2c6:
    c = x->a;
    b = x->r;
    op = 0x33;
  }
  put(op,0x1c,b,c);
switchD_00107a4a_caseD_2be:
  regs[x->r] = 0;
  ret(retSize);
  semicolon();
  return;
}

Assistant:

procedure
void returnStatement(struct object *proc, int retSize)  {
	variable struct item *x;
	x = NULL;
	allocMem(x);
	if (currentSymbol == SYMBOL_SEMICOLON)  {
		getSymbol(); 
	} else  {
		expression(x);
		if (proc->retTypeIndex == x->typeIndex) {
			if (x->mode == CLASS_CONST) {
				put(RISC_ADDI, rv, 0, x->a);
			} elsif (x->mode == CLASS_VAR) {
				put(RISC_LDW, rv, fp, x->a);
			} elsif (x->mode == CLASS_IND) {
				put(RISC_HLDW, rv,x->r,x->a);
			} elsif (x->mode == CLASS_REG) {
				put(RISC_ADD, rv, 0, x->r);
			}
			regs[x->r] = 0; /* free x->r */
			ret(retSize);
		} else {
			mark("wrong return type");
			exit(-1);
		}
		semicolon();
	}
}